

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O3

int apply_to_counts_zz(hdr_histogram *h,uint8_t *counts_data,int32_t data_limit)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  long lVar3;
  int64_t value;
  ulong local_38;
  
  if (data_limit < 1) {
    lVar3 = 0;
  }
  else {
    iVar2 = 0;
    lVar3 = 0;
    local_38 = in_RAX;
    do {
      if (h->counts_len <= iVar2) {
        iVar2 = -0x7526;
        goto LAB_00106157;
      }
      iVar1 = zig_zag_decode_i64(counts_data + lVar3,(int64_t *)&local_38);
      if ((long)local_38 < 0) {
        if (local_38 < 0xffffffff80000001) {
          return -0x7528;
        }
        if ((long)h->counts_len < (long)((long)iVar2 - local_38)) {
          return -0x7528;
        }
        iVar2 = iVar2 - (int)local_38;
      }
      else {
        h->counts[iVar2] = local_38;
        iVar2 = iVar2 + 1;
      }
      lVar3 = lVar3 + iVar1;
    } while (lVar3 < data_limit);
  }
  iVar2 = 0;
LAB_00106157:
  iVar1 = -0x7527;
  if (lVar3 <= data_limit) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int apply_to_counts_zz(struct hdr_histogram* h, const uint8_t* counts_data, const int32_t data_limit)
{
    int64_t data_index = 0;
    int32_t counts_index = 0;
    int64_t value;

    while (data_index < data_limit && counts_index < h->counts_len)
    {
        data_index += zig_zag_decode_i64(&counts_data[data_index], &value);

        if (value < 0)
        {
            int64_t zeros = -value;

            if (value <= INT32_MIN || counts_index + zeros > h->counts_len)
            {
                return HDR_TRAILING_ZEROS_INVALID;
            }

            counts_index += (int32_t) zeros;
        }
        else
        {
            h->counts[counts_index] = value;
            counts_index++;
        }
    }

    if (data_index > data_limit)
    {
        return HDR_VALUE_TRUNCATED;
    }
    else if (data_index < data_limit)
    {
        return HDR_ENCODED_INPUT_TOO_LONG;
    }

    return 0;
}